

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a70a8::QualType::printLeft(QualType *this,OutputStream *S)

{
  uint uVar1;
  StringView R;
  StringView R_00;
  StringView R_01;
  
  (*this->Child->_vptr_Node[4])();
  uVar1 = *(uint *)&(this->super_Node).field_0xc;
  if ((uVar1 & 1) != 0) {
    R.Last = "";
    R.First = " const";
    OutputStream::operator+=(S,R);
    uVar1 = *(uint *)&(this->super_Node).field_0xc;
  }
  if ((uVar1 & 2) != 0) {
    R_00.Last = "";
    R_00.First = " volatile";
    OutputStream::operator+=(S,R_00);
    uVar1 = *(uint *)&(this->super_Node).field_0xc;
  }
  if ((uVar1 & 4) == 0) {
    return;
  }
  R_01.Last = "";
  R_01.First = " restrict";
  OutputStream::operator+=(S,R_01);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Child->printLeft(S);
    printQuals(S);
  }